

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_rw_hook_replace_unsafe(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  char *pcVar1;
  char cVar2;
  fio_data_s *pfVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  fio_lock_i ret;
  
  uVar6 = (uint)((ulong)uuid >> 8);
  fio_rw_hook_validate(rw_hooks);
  lVar5 = (long)(int)uVar6 * 0xa8;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar5 + 0x6e);
  cVar2 = *pcVar1;
  *pcVar1 = '\x01';
  pfVar3 = fio_data;
  UNLOCK();
  iVar4 = -1;
  if (((-1 < uuid) && (uVar6 < fio_data->capa)) &&
     (*(char *)((long)fio_data + lVar5 + 0x6d) == (char)uuid)) {
    *(fio_rw_hook_s **)((long)fio_data + lVar5 + 0xa8) = rw_hooks;
    *(void **)((long)pfVar3 + lVar5 + 0xb0) = udata;
    iVar4 = 0;
  }
  if (cVar2 == '\0') {
    LOCK();
    *(undefined1 *)((long)fio_data + lVar5 + 0x6e) = 0;
    UNLOCK();
  }
  return iVar4;
}

Assistant:

int fio_rw_hook_replace_unsafe(intptr_t uuid, fio_rw_hook_s *rw_hooks,
                               void *udata) {
  int replaced = -1;
  uint8_t was_locked;
  intptr_t fd = fio_uuid2fd(uuid);
  fio_rw_hook_validate(rw_hooks);
  /* protect against some fulishness... but not all of it. */
  was_locked = fio_trylock(&fd_data(fd).sock_lock);
  if (uuid_is_valid(uuid)) {
    fd_data(fd).rw_hooks = rw_hooks;
    fd_data(fd).rw_udata = udata;
    replaced = 0;
  }
  if (!was_locked)
    fio_unlock(&fd_data(fd).sock_lock);
  return replaced;
}